

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tests.cpp
# Opt level: O0

void __thiscall merkle_tests::merkle_test_empty_block::test_method(merkle_test_empty_block *this)

{
  long in_FS_OFFSET;
  bool mutated;
  uint256 root;
  CBlock block;
  CBlock *in_stack_fffffffffffffe38;
  lazy_ostream *in_stack_fffffffffffffe40;
  basic_cstring<const_char> *in_stack_fffffffffffffe48;
  CBlock *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  lazy_ostream *in_stack_fffffffffffffe68;
  const_string *in_stack_fffffffffffffe70;
  const_string *file;
  undefined6 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  bool *mutated_00;
  CBlock *in_stack_fffffffffffffe98;
  lazy_ostream local_149;
  undefined1 local_138 [70];
  lazy_ostream local_f2;
  undefined1 local_e0 [71];
  undefined1 local_99 [33];
  bool local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_99[0] = 0;
  mutated_00 = local_78;
  CBlock::CBlock(in_stack_fffffffffffffe58);
  BlockMerkleRoot(in_stack_fffffffffffffe98,mutated_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffe48,(pointer)in_stack_fffffffffffffe40,
               (unsigned_long)in_stack_fffffffffffffe38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffffe7f,
                        CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
               in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68,
               (const_string *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe40,(char (*) [1])in_stack_fffffffffffffe38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffe48,(pointer)in_stack_fffffffffffffe40,
               (unsigned_long)in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe7f =
         base_blob<256U>::IsNull((base_blob<256U> *)in_stack_fffffffffffffe48);
    local_f2._vptr_lazy_ostream._0_1_ = 1;
    in_stack_fffffffffffffe48 = (basic_cstring<const_char> *)0x1e7be87;
    in_stack_fffffffffffffe40 = &local_f2;
    in_stack_fffffffffffffe38 = (CBlock *)0x1c25aa1;
    local_f2._vptr_lazy_ostream._1_1_ = in_stack_fffffffffffffe7f;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_e0,(undefined1 *)((long)&local_f2._vptr_lazy_ostream + 2),0x103,1,2,
               (undefined1 *)((long)&local_f2._vptr_lazy_ostream + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe7e = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffe7e);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffe48,(pointer)in_stack_fffffffffffffe40,
               (unsigned_long)in_stack_fffffffffffffe38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffffe7f,
                        CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),file,
               (size_t)in_stack_fffffffffffffe68,
               (const_string *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    in_stack_fffffffffffffe68 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe40,(char (*) [1])in_stack_fffffffffffffe38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffe48,(pointer)in_stack_fffffffffffffe40,
               (unsigned_long)in_stack_fffffffffffffe38);
    local_149._vptr_lazy_ostream._0_1_ = 0;
    in_stack_fffffffffffffe48 = (basic_cstring<const_char> *)0x1e5e060;
    in_stack_fffffffffffffe40 = &local_149;
    in_stack_fffffffffffffe38 = (CBlock *)0x1bbff6e;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_138,(undefined1 *)((long)&local_149._vptr_lazy_ostream + 1),0x104,1,2,local_99)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe67 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffe67);
  CBlock::~CBlock(in_stack_fffffffffffffe38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_test_empty_block)
{
    bool mutated = false;
    CBlock block;
    uint256 root = BlockMerkleRoot(block, &mutated);

    BOOST_CHECK_EQUAL(root.IsNull(), true);
    BOOST_CHECK_EQUAL(mutated, false);
}